

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix4d * tinyusdz::to_matrix(matrix3d *m33,double3 *tx)

{
  double dVar1;
  long lVar2;
  matrix4d *in_RDI;
  
  in_RDI->m[3][1] = 0.0;
  in_RDI->m[3][2] = 0.0;
  in_RDI->m[2][3] = 0.0;
  in_RDI->m[3][0] = 0.0;
  in_RDI->m[2][1] = 0.0;
  in_RDI->m[2][2] = 0.0;
  in_RDI->m[1][3] = 0.0;
  in_RDI->m[2][0] = 0.0;
  in_RDI->m[1][1] = 0.0;
  in_RDI->m[1][2] = 0.0;
  in_RDI->m[0][3] = 0.0;
  in_RDI->m[1][0] = 0.0;
  in_RDI->m[3][3] = 0.0;
  lVar2 = 0;
  do {
    *(undefined8 *)((long)in_RDI->m[0] + lVar2) = 0x3ff0000000000000;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0xa0);
  dVar1 = m33->m[0][1];
  in_RDI->m[0][0] = m33->m[0][0];
  in_RDI->m[0][1] = dVar1;
  in_RDI->m[0][2] = m33->m[0][2];
  dVar1 = m33->m[1][1];
  in_RDI->m[1][0] = m33->m[1][0];
  in_RDI->m[1][1] = dVar1;
  in_RDI->m[1][2] = m33->m[1][2];
  dVar1 = m33->m[2][1];
  in_RDI->m[2][0] = m33->m[2][0];
  in_RDI->m[2][1] = dVar1;
  in_RDI->m[2][2] = m33->m[2][2];
  dVar1 = tx->_M_elems[1];
  in_RDI->m[3][0] = tx->_M_elems[0];
  in_RDI->m[3][1] = dVar1;
  in_RDI->m[3][2] = tx->_M_elems[2];
  return in_RDI;
}

Assistant:

value::matrix4d to_matrix(const value::matrix3d &m33,
                          const value::double3 &tx) {
  value::matrix4d m;
  Identity(&m);

  m.m[0][0] = m33.m[0][0];
  m.m[0][1] = m33.m[0][1];
  m.m[0][2] = m33.m[0][2];
  m.m[1][0] = m33.m[1][0];
  m.m[1][1] = m33.m[1][1];
  m.m[1][2] = m33.m[1][2];
  m.m[2][0] = m33.m[2][0];
  m.m[2][1] = m33.m[2][1];
  m.m[2][2] = m33.m[2][2];

  m.m[3][0] = tx[0];
  m.m[3][1] = tx[1];
  m.m[3][2] = tx[2];

  return m;
}